

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O1

void idct32_low16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  __m256i clamp_hi;
  __m256i clamp_lo;
  __m256i bf1 [32];
  int local_4a0;
  int iStack_49c;
  int iStack_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  int iStack_488;
  int iStack_484;
  int local_480;
  int iStack_47c;
  int iStack_478;
  int iStack_474;
  int iStack_470;
  int iStack_46c;
  int iStack_468;
  int iStack_464;
  __m256i local_460;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  lVar37 = (long)bit * 0x100;
  iVar21 = -*(int *)((long)vert_filter_length_chroma + lVar37 + 0x248);
  iVar22 = -*(int *)((long)vert_filter_length_chroma + lVar37 + 0x208);
  iVar23 = -*(int *)((long)vert_filter_length_chroma + lVar37 + 0x228);
  iVar24 = -*(int *)((long)vert_filter_length_chroma + lVar37 + 0x1e8);
  iVar25 = -*(int *)((long)vert_filter_length_chroma + lVar37 + 0x230);
  iVar26 = -*(int *)((long)vert_filter_length_chroma + lVar37 + 0x1f0);
  iVar35 = 1 << ((char)bit - 1U & 0x1f);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar37 + 0x240);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar37 + 0x1c0);
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar37 + 0x200);
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar37 + 0x180);
  iVar33 = -iVar4;
  iVar34 = -iVar5;
  iVar38 = -iVar2;
  iVar29 = -iVar3;
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar37 + 0x1e0);
  iVar30 = -iVar6;
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar37 + 0x220);
  iVar31 = -iVar7;
  iVar8 = *(int *)((long)vert_filter_length_chroma + lVar37 + 0x1a0);
  iVar32 = -iVar8;
  iVar36 = bd + 6 + (uint)(do_cols == 0) * 2;
  local_4a0 = 0x8000;
  if (0xf < iVar36) {
    local_4a0 = 1 << ((char)iVar36 - 1U & 0x1f);
  }
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 600);
  auVar69._4_4_ = uVar1;
  auVar69._0_4_ = uVar1;
  auVar69._8_4_ = uVar1;
  auVar69._12_4_ = uVar1;
  auVar69._16_4_ = uVar1;
  auVar69._20_4_ = uVar1;
  auVar69._24_4_ = uVar1;
  auVar69._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x1d8);
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  auVar51._16_4_ = uVar1;
  auVar51._20_4_ = uVar1;
  auVar51._24_4_ = uVar1;
  auVar51._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x218);
  auVar59._4_4_ = uVar1;
  auVar59._0_4_ = uVar1;
  auVar59._8_4_ = uVar1;
  auVar59._12_4_ = uVar1;
  auVar59._16_4_ = uVar1;
  auVar59._20_4_ = uVar1;
  auVar59._24_4_ = uVar1;
  auVar59._28_4_ = uVar1;
  local_480 = -local_4a0;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x1a8);
  auVar62._4_4_ = uVar1;
  auVar62._0_4_ = uVar1;
  auVar62._8_4_ = uVar1;
  auVar62._12_4_ = uVar1;
  auVar62._16_4_ = uVar1;
  auVar62._20_4_ = uVar1;
  auVar62._24_4_ = uVar1;
  auVar62._28_4_ = uVar1;
  local_4a0 = local_4a0 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x168);
  auVar65._4_4_ = uVar1;
  auVar65._0_4_ = uVar1;
  auVar65._8_4_ = uVar1;
  auVar65._12_4_ = uVar1;
  auVar65._16_4_ = uVar1;
  auVar65._20_4_ = uVar1;
  auVar65._24_4_ = uVar1;
  auVar65._28_4_ = uVar1;
  auVar63._4_4_ = iVar35;
  auVar63._0_4_ = iVar35;
  auVar63._8_4_ = iVar35;
  auVar63._12_4_ = iVar35;
  auVar63._16_4_ = iVar35;
  auVar63._20_4_ = iVar35;
  auVar63._24_4_ = iVar35;
  auVar63._28_4_ = iVar35;
  auVar40 = vpmulld_avx2((undefined1  [32])in[1],auVar65);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar9 = vpsrad_avx2(auVar40,ZEXT416((uint)bit));
  auVar39._4_4_ = iVar24;
  auVar39._0_4_ = iVar24;
  auVar39._8_4_ = iVar24;
  auVar39._12_4_ = iVar24;
  auVar39._16_4_ = iVar24;
  auVar39._20_4_ = iVar24;
  auVar39._24_4_ = iVar24;
  auVar39._28_4_ = iVar24;
  auVar40 = vpmulld_avx2((undefined1  [32])in[1],auVar69);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar65 = vpsrad_avx2(auVar40,ZEXT416((uint)bit));
  auVar40 = vpmulld_avx2((undefined1  [32])in[0xf],auVar39);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar64 = ZEXT416((uint)bit);
  auVar48 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpmulld_avx2((undefined1  [32])in[0xf],auVar51);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar69 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpmulld_avx2((undefined1  [32])in[9],auVar62);
  auVar39 = vpmulld_avx2((undefined1  [32])in[9],auVar59);
  auVar52._4_4_ = iVar23;
  auVar52._0_4_ = iVar23;
  auVar52._8_4_ = iVar23;
  auVar52._12_4_ = iVar23;
  auVar52._16_4_ = iVar23;
  auVar52._20_4_ = iVar23;
  auVar52._24_4_ = iVar23;
  auVar52._28_4_ = iVar23;
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar59 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpaddd_avx2(auVar39,auVar63);
  auVar51 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpmulld_avx2((undefined1  [32])in[7],auVar52);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x198);
  auVar53._4_4_ = uVar1;
  auVar53._0_4_ = uVar1;
  auVar53._8_4_ = uVar1;
  auVar53._12_4_ = uVar1;
  auVar53._16_4_ = uVar1;
  auVar53._20_4_ = uVar1;
  auVar53._24_4_ = uVar1;
  auVar53._28_4_ = uVar1;
  auVar39 = vpmulld_avx2((undefined1  [32])in[7],auVar53);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar64 = ZEXT416((uint)bit);
  auVar44 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpaddd_avx2(auVar39,auVar63);
  auVar53 = vpsrad_avx2(auVar40,auVar64);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x188);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  auVar40 = vpmulld_avx2((undefined1  [32])in[5],auVar40);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x238);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  auVar54._16_4_ = uVar1;
  auVar54._20_4_ = uVar1;
  auVar54._24_4_ = uVar1;
  auVar54._28_4_ = uVar1;
  auVar39 = vpmulld_avx2((undefined1  [32])in[5],auVar54);
  auVar55._4_4_ = iVar22;
  auVar55._0_4_ = iVar22;
  auVar55._8_4_ = iVar22;
  auVar55._12_4_ = iVar22;
  auVar55._16_4_ = iVar22;
  auVar55._20_4_ = iVar22;
  auVar55._24_4_ = iVar22;
  auVar55._28_4_ = iVar22;
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar52 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpaddd_avx2(auVar39,auVar63);
  auVar54 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpmulld_avx2((undefined1  [32])in[0xb],auVar55);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar49 = vpsrad_avx2(auVar40,auVar64);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x1b8);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar45._16_4_ = uVar1;
  auVar45._20_4_ = uVar1;
  auVar45._24_4_ = uVar1;
  auVar45._28_4_ = uVar1;
  auVar40 = vpmulld_avx2((undefined1  [32])in[0xb],auVar45);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar45 = vpsrad_avx2(auVar40,auVar64);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x1c8);
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar41._16_4_ = uVar1;
  auVar41._20_4_ = uVar1;
  auVar41._24_4_ = uVar1;
  auVar41._28_4_ = uVar1;
  auVar40 = vpmulld_avx2((undefined1  [32])in[0xd],auVar41);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x1f8);
  auVar56._4_4_ = uVar1;
  auVar56._0_4_ = uVar1;
  auVar56._8_4_ = uVar1;
  auVar56._12_4_ = uVar1;
  auVar56._16_4_ = uVar1;
  auVar56._20_4_ = uVar1;
  auVar56._24_4_ = uVar1;
  auVar56._28_4_ = uVar1;
  auVar39 = vpmulld_avx2((undefined1  [32])in[0xd],auVar56);
  auVar60._4_4_ = iVar21;
  auVar60._0_4_ = iVar21;
  auVar60._8_4_ = iVar21;
  auVar60._12_4_ = iVar21;
  auVar60._16_4_ = iVar21;
  auVar60._20_4_ = iVar21;
  auVar60._24_4_ = iVar21;
  auVar60._28_4_ = iVar21;
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar55 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpaddd_avx2(auVar39,auVar63);
  auVar56 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpmulld_avx2((undefined1  [32])in[3],auVar60);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x178);
  auVar61._4_4_ = uVar1;
  auVar61._0_4_ = uVar1;
  auVar61._8_4_ = uVar1;
  auVar61._12_4_ = uVar1;
  auVar61._16_4_ = uVar1;
  auVar61._20_4_ = uVar1;
  auVar61._24_4_ = uVar1;
  auVar61._28_4_ = uVar1;
  auVar39 = vpmulld_avx2((undefined1  [32])in[3],auVar61);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar64 = ZEXT416((uint)bit);
  auVar60 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpaddd_avx2(auVar39,auVar63);
  auVar61 = vpsrad_avx2(auVar40,auVar64);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x170);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  auVar46._16_4_ = uVar1;
  auVar46._20_4_ = uVar1;
  auVar46._24_4_ = uVar1;
  auVar46._28_4_ = uVar1;
  auVar40 = vpmulld_avx2((undefined1  [32])in[2],auVar46);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x250);
  auVar72._4_4_ = uVar1;
  auVar72._0_4_ = uVar1;
  auVar72._8_4_ = uVar1;
  auVar72._12_4_ = uVar1;
  auVar72._16_4_ = uVar1;
  auVar72._20_4_ = uVar1;
  auVar72._24_4_ = uVar1;
  auVar72._28_4_ = uVar1;
  auVar39 = vpmulld_avx2((undefined1  [32])in[2],auVar72);
  auVar73._4_4_ = iVar26;
  auVar73._0_4_ = iVar26;
  auVar73._8_4_ = iVar26;
  auVar73._12_4_ = iVar26;
  auVar73._16_4_ = iVar26;
  auVar73._20_4_ = iVar26;
  auVar73._24_4_ = iVar26;
  auVar73._28_4_ = iVar26;
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar46 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpaddd_avx2(auVar39,auVar63);
  auVar62 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpmulld_avx2((undefined1  [32])in[0xe],auVar73);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar10 = vpsrad_avx2(auVar40,auVar64);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x1d0);
  auVar74._4_4_ = uVar1;
  auVar74._0_4_ = uVar1;
  auVar74._8_4_ = uVar1;
  auVar74._12_4_ = uVar1;
  auVar74._16_4_ = uVar1;
  auVar74._20_4_ = uVar1;
  auVar74._24_4_ = uVar1;
  auVar74._28_4_ = uVar1;
  auVar40 = vpmulld_avx2((undefined1  [32])in[0xe],auVar74);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar72 = vpsrad_avx2(auVar40,auVar64);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x1b0);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar47._16_4_ = uVar1;
  auVar47._20_4_ = uVar1;
  auVar47._24_4_ = uVar1;
  auVar47._28_4_ = uVar1;
  auVar40 = vpmulld_avx2((undefined1  [32])in[10],auVar47);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 0x210);
  auVar78._4_4_ = uVar1;
  auVar78._0_4_ = uVar1;
  auVar78._8_4_ = uVar1;
  auVar78._12_4_ = uVar1;
  auVar78._16_4_ = uVar1;
  auVar78._20_4_ = uVar1;
  auVar78._24_4_ = uVar1;
  auVar78._28_4_ = uVar1;
  auVar39 = vpmulld_avx2((undefined1  [32])in[10],auVar78);
  auVar42._4_4_ = iVar25;
  auVar42._0_4_ = iVar25;
  auVar42._8_4_ = iVar25;
  auVar42._12_4_ = iVar25;
  auVar42._16_4_ = iVar25;
  auVar42._20_4_ = iVar25;
  auVar42._24_4_ = iVar25;
  auVar42._28_4_ = iVar25;
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar47 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpaddd_avx2(auVar39,auVar63);
  auVar11 = vpsrad_avx2(auVar40,auVar64);
  auVar41 = vpmulld_avx2((undefined1  [32])in[6],auVar42);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar37 + 400);
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  auVar43._16_4_ = uVar1;
  auVar43._20_4_ = uVar1;
  auVar43._24_4_ = uVar1;
  auVar43._28_4_ = uVar1;
  auVar42 = vpmulld_avx2((undefined1  [32])in[6],auVar43);
  auVar40 = vpaddd_avx2(auVar48,auVar65);
  auVar43 = vpsubd_avx2(auVar65,auVar48);
  auVar39 = vpaddd_avx2(auVar44,auVar51);
  auVar57 = vpsubd_avx2(auVar44,auVar51);
  auVar65 = vpaddd_avx2(auVar49,auVar54);
  auVar67 = vpsubd_avx2(auVar54,auVar49);
  auVar48 = vpaddd_avx2(auVar60,auVar56);
  auVar73 = vpsubd_avx2(auVar60,auVar56);
  auVar51 = vpaddd_avx2(auVar61,auVar55);
  auVar74 = vpsubd_avx2(auVar61,auVar55);
  auVar44 = vpaddd_avx2(auVar45,auVar52);
  auVar78 = vpsubd_avx2(auVar52,auVar45);
  auVar52 = vpaddd_avx2(auVar53,auVar59);
  auVar12 = vpsubd_avx2(auVar53,auVar59);
  auVar59 = vpaddd_avx2(auVar69,auVar9);
  auVar49 = vpsubd_avx2(auVar9,auVar69);
  auVar41 = vpaddd_avx2(auVar63,auVar41);
  auVar69 = vpsrad_avx2(auVar41,auVar64);
  auVar41 = vpaddd_avx2(auVar10,auVar62);
  auVar13 = vpsubd_avx2(auVar62,auVar10);
  auVar9 = vpaddd_avx2(auVar69,auVar11);
  auVar14 = vpsubd_avx2(auVar69,auVar11);
  auVar42 = vpaddd_avx2(auVar63,auVar42);
  auVar69 = vpsrad_avx2(auVar42,auVar64);
  auVar42 = vpaddd_avx2(auVar47,auVar69);
  auVar15 = vpsubd_avx2(auVar69,auVar47);
  auVar69 = vpaddd_avx2(auVar72,auVar46);
  auVar16 = vpsubd_avx2(auVar46,auVar72);
  auVar66._4_4_ = iVar2;
  auVar66._0_4_ = iVar2;
  auVar66._8_4_ = iVar2;
  auVar66._12_4_ = iVar2;
  auVar66._16_4_ = iVar2;
  auVar66._20_4_ = iVar2;
  auVar66._24_4_ = iVar2;
  auVar66._28_4_ = iVar2;
  auVar71._4_4_ = iVar34;
  auVar71._0_4_ = iVar34;
  auVar71._8_4_ = iVar34;
  auVar71._12_4_ = iVar34;
  auVar71._16_4_ = iVar34;
  auVar71._20_4_ = iVar34;
  auVar71._24_4_ = iVar34;
  auVar71._28_4_ = iVar34;
  auVar28._4_4_ = local_480;
  auVar28._0_4_ = local_480;
  auVar28._8_4_ = local_480;
  auVar28._12_4_ = local_480;
  auVar28._16_4_ = local_480;
  auVar28._20_4_ = local_480;
  auVar28._24_4_ = local_480;
  auVar28._28_4_ = local_480;
  auVar53 = vpmaxsd_avx2(auVar28,auVar43);
  auVar27._4_4_ = local_4a0;
  auVar27._0_4_ = local_4a0;
  auVar27._8_4_ = local_4a0;
  auVar27._12_4_ = local_4a0;
  auVar27._16_4_ = local_4a0;
  auVar27._20_4_ = local_4a0;
  auVar27._24_4_ = local_4a0;
  auVar27._28_4_ = local_4a0;
  auVar54 = vpminsd_avx2(auVar53,auVar27);
  auVar53 = vpmaxsd_avx2(auVar49,auVar28);
  auVar49 = vpminsd_avx2(auVar53,auVar27);
  auVar53 = vpmulld_avx2(auVar49,auVar66);
  auVar53 = vpaddd_avx2(auVar63,auVar53);
  auVar45 = vpmulld_avx2(auVar54,auVar71);
  auVar53 = vpaddd_avx2(auVar45,auVar53);
  auVar76._4_4_ = iVar5;
  auVar76._0_4_ = iVar5;
  auVar76._8_4_ = iVar5;
  auVar76._12_4_ = iVar5;
  auVar76._16_4_ = iVar5;
  auVar76._20_4_ = iVar5;
  auVar76._24_4_ = iVar5;
  auVar76._28_4_ = iVar5;
  auVar40 = vpmaxsd_avx2(auVar28,auVar40);
  auVar45 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar39,auVar28);
  auVar55 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar57,auVar28);
  auVar56 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar65);
  auVar60 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar67,auVar28);
  auVar61 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar48);
  auVar46 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar73);
  auVar62 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar51);
  auVar10 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar74);
  auVar72 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar44);
  auVar47 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar78);
  auVar51 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar52);
  auVar11 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar12);
  auVar65 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar59);
  auVar43 = vpminsd_avx2(auVar40,auVar27);
  auVar39 = vpmulld_avx2(auVar54,auVar66);
  auVar40 = vpmulld_avx2(auVar49,auVar76);
  auVar40 = vpaddd_avx2(auVar63,auVar40);
  auVar40 = vpaddd_avx2(auVar39,auVar40);
  auVar48._4_4_ = iVar38;
  auVar48._0_4_ = iVar38;
  auVar48._8_4_ = iVar38;
  auVar48._12_4_ = iVar38;
  auVar48._16_4_ = iVar38;
  auVar48._20_4_ = iVar38;
  auVar48._24_4_ = iVar38;
  auVar48._28_4_ = iVar38;
  auVar48 = vpmulld_avx2(auVar56,auVar48);
  auVar39 = vpmulld_avx2(auVar65,auVar71);
  auVar39 = vpaddd_avx2(auVar63,auVar39);
  auVar39 = vpaddd_avx2(auVar48,auVar39);
  auVar48 = vpmulld_avx2(auVar56,auVar71);
  auVar52 = vpmulld_avx2((undefined1  [32])in[4],auVar76);
  auVar59 = vpmulld_avx2((undefined1  [32])in[4],auVar66);
  auVar65 = vpmulld_avx2(auVar65,auVar66);
  auVar65 = vpaddd_avx2(auVar63,auVar65);
  auVar65 = vpaddd_avx2(auVar48,auVar65);
  auVar57._4_4_ = iVar3;
  auVar57._0_4_ = iVar3;
  auVar57._8_4_ = iVar3;
  auVar57._12_4_ = iVar3;
  auVar57._16_4_ = iVar3;
  auVar57._20_4_ = iVar3;
  auVar57._24_4_ = iVar3;
  auVar57._28_4_ = iVar3;
  auVar49._4_4_ = iVar33;
  auVar49._0_4_ = iVar33;
  auVar49._8_4_ = iVar33;
  auVar49._12_4_ = iVar33;
  auVar49._16_4_ = iVar33;
  auVar49._20_4_ = iVar33;
  auVar49._24_4_ = iVar33;
  auVar49._28_4_ = iVar33;
  auVar48 = vpmulld_avx2(auVar51,auVar57);
  auVar48 = vpaddd_avx2(auVar63,auVar48);
  auVar44 = vpmulld_avx2(auVar61,auVar49);
  auVar48 = vpaddd_avx2(auVar44,auVar48);
  auVar67._4_4_ = iVar4;
  auVar67._0_4_ = iVar4;
  auVar67._8_4_ = iVar4;
  auVar67._12_4_ = iVar4;
  auVar67._16_4_ = iVar4;
  auVar67._20_4_ = iVar4;
  auVar67._24_4_ = iVar4;
  auVar67._28_4_ = iVar4;
  auVar51 = vpmulld_avx2(auVar51,auVar67);
  auVar44 = vpmulld_avx2(auVar61,auVar57);
  auVar51 = vpaddd_avx2(auVar63,auVar51);
  auVar51 = vpaddd_avx2(auVar44,auVar51);
  auVar44._4_4_ = iVar29;
  auVar44._0_4_ = iVar29;
  auVar44._8_4_ = iVar29;
  auVar44._12_4_ = iVar29;
  auVar44._16_4_ = iVar29;
  auVar44._20_4_ = iVar29;
  auVar44._24_4_ = iVar29;
  auVar44._28_4_ = iVar29;
  auVar54 = vpmulld_avx2(auVar62,auVar44);
  auVar44 = vpmulld_avx2(auVar72,auVar49);
  auVar44 = vpaddd_avx2(auVar63,auVar44);
  auVar44 = vpaddd_avx2(auVar54,auVar44);
  auVar52 = vpaddd_avx2(auVar52,auVar63);
  auVar56 = vpsrad_avx2(auVar52,auVar64);
  auVar52 = vpaddd_avx2(auVar59,auVar63);
  auVar61 = vpsrad_avx2(auVar52,auVar64);
  auVar59 = vpmulld_avx2(auVar62,auVar49);
  auVar54 = vpmulld_avx2((undefined1  [32])in[0xc],auVar49);
  auVar49 = vpmulld_avx2((undefined1  [32])in[0xc],auVar57);
  auVar52 = vpmulld_avx2(auVar72,auVar57);
  auVar52 = vpaddd_avx2(auVar63,auVar52);
  auVar52 = vpaddd_avx2(auVar59,auVar52);
  auVar59 = vpaddd_avx2(auVar54,auVar63);
  auVar54 = vpsrad_avx2(auVar59,auVar64);
  auVar59 = vpaddd_avx2(auVar49,auVar63);
  auVar49 = vpsrad_avx2(auVar59,auVar64);
  auVar59 = vpaddd_avx2(auVar54,auVar61);
  auVar74 = vpsubd_avx2(auVar61,auVar54);
  auVar54 = vpaddd_avx2(auVar49,auVar56);
  auVar78 = vpsubd_avx2(auVar56,auVar49);
  auVar70._4_4_ = iVar7;
  auVar70._0_4_ = iVar7;
  auVar70._8_4_ = iVar7;
  auVar70._12_4_ = iVar7;
  auVar70._16_4_ = iVar7;
  auVar70._20_4_ = iVar7;
  auVar70._24_4_ = iVar7;
  auVar70._28_4_ = iVar7;
  auVar75._4_4_ = iVar32;
  auVar75._0_4_ = iVar32;
  auVar75._8_4_ = iVar32;
  auVar75._12_4_ = iVar32;
  auVar75._16_4_ = iVar32;
  auVar75._20_4_ = iVar32;
  auVar75._24_4_ = iVar32;
  auVar75._28_4_ = iVar32;
  auVar49 = vpmaxsd_avx2(auVar28,auVar13);
  auVar56 = vpminsd_avx2(auVar49,auVar27);
  auVar49 = vpmaxsd_avx2(auVar28,auVar16);
  auVar61 = vpminsd_avx2(auVar49,auVar27);
  auVar49 = vpmulld_avx2(auVar61,auVar70);
  auVar49 = vpaddd_avx2(auVar63,auVar49);
  auVar62 = vpmulld_avx2(auVar56,auVar75);
  auVar49 = vpaddd_avx2(auVar62,auVar49);
  auVar77._4_4_ = iVar8;
  auVar77._0_4_ = iVar8;
  auVar77._8_4_ = iVar8;
  auVar77._12_4_ = iVar8;
  auVar77._16_4_ = iVar8;
  auVar77._20_4_ = iVar8;
  auVar77._24_4_ = iVar8;
  auVar77._28_4_ = iVar8;
  auVar41 = vpmaxsd_avx2(auVar28,auVar41);
  auVar62 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar9);
  auVar72 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar14);
  auVar57 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar42);
  auVar67 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar15);
  auVar42 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar69);
  auVar73 = vpminsd_avx2(auVar41,auVar27);
  auVar9 = vpmulld_avx2(auVar56,auVar70);
  auVar41 = vpmulld_avx2(auVar61,auVar77);
  auVar41 = vpaddd_avx2(auVar63,auVar41);
  auVar41 = vpaddd_avx2(auVar9,auVar41);
  auVar50._4_4_ = iVar31;
  auVar50._0_4_ = iVar31;
  auVar50._8_4_ = iVar31;
  auVar50._12_4_ = iVar31;
  auVar50._16_4_ = iVar31;
  auVar50._20_4_ = iVar31;
  auVar50._24_4_ = iVar31;
  auVar50._28_4_ = iVar31;
  auVar9 = vpmulld_avx2(auVar42,auVar75);
  auVar9 = vpaddd_avx2(auVar63,auVar9);
  auVar69 = vpmulld_avx2(auVar57,auVar50);
  auVar9 = vpaddd_avx2(auVar69,auVar9);
  auVar69 = vpmulld_avx2(auVar57,auVar75);
  auVar42 = vpmulld_avx2(auVar42,auVar70);
  auVar42 = vpaddd_avx2(auVar63,auVar42);
  auVar42 = vpaddd_avx2(auVar69,auVar42);
  auVar69 = vpaddd_avx2(auVar55,auVar45);
  auVar57 = vpsubd_avx2(auVar45,auVar55);
  auVar53 = vpsrad_avx2(auVar53,auVar64);
  auVar45 = vpsrad_avx2(auVar40,auVar64);
  auVar64 = ZEXT416((uint)bit);
  auVar39 = vpsrad_avx2(auVar39,auVar64);
  auVar55 = vpsrad_avx2(auVar65,auVar64);
  auVar40 = vpaddd_avx2(auVar39,auVar53);
  auVar12 = vpsubd_avx2(auVar53,auVar39);
  auVar39 = vpaddd_avx2(auVar60,auVar46);
  auVar13 = vpsubd_avx2(auVar46,auVar60);
  auVar48 = vpsrad_avx2(auVar48,auVar64);
  auVar53 = vpsrad_avx2(auVar51,auVar64);
  auVar51 = vpsrad_avx2(auVar44,auVar64);
  auVar44 = vpsrad_avx2(auVar52,auVar64);
  auVar65 = vpaddd_avx2(auVar51,auVar48);
  auVar14 = vpsubd_avx2(auVar51,auVar48);
  auVar48 = vpaddd_avx2(auVar47,auVar10);
  auVar15 = vpsubd_avx2(auVar10,auVar47);
  auVar51 = vpaddd_avx2(auVar44,auVar53);
  auVar16 = vpsubd_avx2(auVar44,auVar53);
  auVar44 = vpaddd_avx2(auVar11,auVar43);
  auVar66 = vpsubd_avx2(auVar43,auVar11);
  auVar68._4_4_ = iVar6;
  auVar68._0_4_ = iVar6;
  auVar68._8_4_ = iVar6;
  auVar68._12_4_ = iVar6;
  auVar68._16_4_ = iVar6;
  auVar68._20_4_ = iVar6;
  auVar68._24_4_ = iVar6;
  auVar68._28_4_ = iVar6;
  auVar53 = vpmulld_avx2(auVar68,(undefined1  [32])*in);
  auVar52 = vpaddd_avx2(auVar55,auVar45);
  auVar10 = vpsubd_avx2(auVar45,auVar55);
  auVar53 = vpaddd_avx2(auVar53,auVar63);
  auVar55 = vpsrad_avx2(auVar53,auVar64);
  auVar53 = vpmulld_avx2((undefined1  [32])in[8],auVar77);
  auVar53 = vpaddd_avx2(auVar53,auVar63);
  auVar45 = vpsrad_avx2(auVar53,auVar64);
  auVar53 = vpmulld_avx2((undefined1  [32])in[8],auVar70);
  auVar53 = vpaddd_avx2(auVar53,auVar63);
  auVar56 = vpsrad_avx2(auVar53,auVar64);
  auVar53 = vpaddd_avx2(auVar45,auVar55);
  auVar71 = vpsubd_avx2(auVar55,auVar45);
  auVar45 = vpaddd_avx2(auVar56,auVar55);
  auVar76 = vpsubd_avx2(auVar55,auVar56);
  auVar58._4_4_ = iVar30;
  auVar58._0_4_ = iVar30;
  auVar58._8_4_ = iVar30;
  auVar58._12_4_ = iVar30;
  auVar58._16_4_ = iVar30;
  auVar58._20_4_ = iVar30;
  auVar58._24_4_ = iVar30;
  auVar58._28_4_ = iVar30;
  auVar55 = vpmaxsd_avx2(auVar28,auVar74);
  auVar56 = vpminsd_avx2(auVar55,auVar27);
  auVar55 = vpmaxsd_avx2(auVar28,auVar78);
  auVar60 = vpminsd_avx2(auVar55,auVar27);
  auVar55 = vpmulld_avx2(auVar60,auVar68);
  auVar55 = vpaddd_avx2(auVar55,auVar63);
  auVar61 = vpmulld_avx2(auVar56,auVar58);
  auVar55 = vpaddd_avx2(auVar61,auVar55);
  auVar59 = vpmaxsd_avx2(auVar28,auVar59);
  auVar61 = vpminsd_avx2(auVar59,auVar27);
  auVar59 = vpmaxsd_avx2(auVar28,auVar54);
  auVar46 = vpminsd_avx2(auVar59,auVar27);
  auVar59 = vpaddd_avx2(auVar60,auVar56);
  auVar54 = vpaddd_avx2(auVar72,auVar62);
  auVar17 = vpsubd_avx2(auVar62,auVar72);
  auVar49 = vpsrad_avx2(auVar49,auVar64);
  auVar56 = vpsrad_avx2(auVar41,auVar64);
  auVar9 = vpsrad_avx2(auVar9,auVar64);
  auVar60 = vpsrad_avx2(auVar42,auVar64);
  auVar41 = vpaddd_avx2(auVar9,auVar49);
  auVar18 = vpsubd_avx2(auVar49,auVar9);
  auVar9 = vpaddd_avx2(auVar67,auVar73);
  auVar19 = vpsubd_avx2(auVar73,auVar67);
  auVar42 = vpaddd_avx2(auVar60,auVar56);
  auVar20 = vpsubd_avx2(auVar56,auVar60);
  auVar49 = vpmaxsd_avx2(auVar28,auVar12);
  auVar56 = vpminsd_avx2(auVar49,auVar27);
  auVar49 = vpmaxsd_avx2(auVar10,auVar28);
  auVar60 = vpminsd_avx2(auVar49,auVar27);
  auVar49 = vpmulld_avx2(auVar56,auVar75);
  auVar49 = vpaddd_avx2(auVar49,auVar63);
  auVar62 = vpmulld_avx2(auVar60,auVar70);
  auVar49 = vpaddd_avx2(auVar49,auVar62);
  auVar69 = vpmaxsd_avx2(auVar28,auVar69);
  auVar62 = vpminsd_avx2(auVar69,auVar27);
  auVar69 = vpmaxsd_avx2(auVar28,auVar57);
  auVar69 = vpminsd_avx2(auVar69,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar40);
  auVar10 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar39);
  auVar72 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar13);
  auVar47 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar65);
  auVar11 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar14);
  auVar43 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar48);
  auVar57 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar15);
  auVar67 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar51);
  auVar73 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar16);
  auVar74 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar44);
  auVar78 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar66);
  auVar65 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar28,auVar52);
  auVar12 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmulld_avx2(auVar56,auVar70);
  auVar39 = vpmulld_avx2(auVar60,auVar77);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar40 = vpaddd_avx2(auVar39,auVar40);
  auVar39 = vpmulld_avx2(auVar65,auVar70);
  auVar39 = vpaddd_avx2(auVar63,auVar39);
  auVar48 = vpmulld_avx2(auVar69,auVar75);
  auVar39 = vpaddd_avx2(auVar48,auVar39);
  auVar65 = vpmulld_avx2(auVar65,auVar77);
  auVar48 = vpmulld_avx2(auVar69,auVar70);
  auVar65 = vpaddd_avx2(auVar63,auVar65);
  auVar65 = vpaddd_avx2(auVar48,auVar65);
  auVar48 = vpmulld_avx2(auVar67,auVar75);
  auVar48 = vpaddd_avx2(auVar63,auVar48);
  auVar51 = vpmulld_avx2(auVar47,auVar50);
  auVar48 = vpaddd_avx2(auVar51,auVar48);
  auVar44 = vpmulld_avx2(auVar47,auVar75);
  auVar51 = vpmulld_avx2(auVar67,auVar70);
  auVar51 = vpaddd_avx2(auVar63,auVar51);
  auVar51 = vpaddd_avx2(auVar44,auVar51);
  auVar44 = vpmulld_avx2(auVar43,auVar50);
  auVar44 = vpaddd_avx2(auVar44,auVar63);
  auVar52 = vpmulld_avx2(auVar74,auVar75);
  auVar44 = vpaddd_avx2(auVar44,auVar52);
  auVar52 = vpmulld_avx2(auVar43,auVar75);
  auVar69 = vpmulld_avx2(auVar74,auVar70);
  auVar52 = vpaddd_avx2(auVar52,auVar63);
  auVar52 = vpaddd_avx2(auVar52,auVar69);
  auVar69 = vpmaxsd_avx2(auVar28,auVar53);
  auVar53 = vpminsd_avx2(auVar69,auVar27);
  auVar69 = vpaddd_avx2(auVar53,auVar46);
  auVar46 = vpsubd_avx2(auVar53,auVar46);
  auVar53 = vpmaxsd_avx2(auVar28,auVar71);
  auVar56 = vpminsd_avx2(auVar53,auVar27);
  auVar53 = vpmaxsd_avx2(auVar28,auVar45);
  auVar45 = vpminsd_avx2(auVar53,auVar27);
  auVar53 = vpmaxsd_avx2(auVar28,auVar76);
  auVar60 = vpminsd_avx2(auVar53,auVar27);
  auVar59 = vpmulld_avx2(auVar68,auVar59);
  auVar59 = vpaddd_avx2(auVar59,auVar63);
  auVar53 = vpsrad_avx2(auVar59,auVar64);
  auVar59 = vpaddd_avx2(auVar53,auVar45);
  auVar13 = vpsubd_avx2(auVar45,auVar53);
  auVar45 = vpsrad_avx2(auVar55,auVar64);
  auVar53 = vpaddd_avx2(auVar45,auVar60);
  auVar14 = vpsubd_avx2(auVar60,auVar45);
  auVar45 = vpaddd_avx2(auVar56,auVar61);
  auVar15 = vpsubd_avx2(auVar56,auVar61);
  auVar55 = vpmaxsd_avx2(auVar28,auVar18);
  auVar56 = vpminsd_avx2(auVar55,auVar27);
  auVar55 = vpmaxsd_avx2(auVar28,auVar20);
  auVar60 = vpminsd_avx2(auVar55,auVar27);
  auVar55 = vpmulld_avx2(auVar56,auVar58);
  auVar55 = vpaddd_avx2(auVar55,auVar63);
  auVar61 = vpmulld_avx2(auVar60,auVar68);
  auVar55 = vpaddd_avx2(auVar55,auVar61);
  auVar54 = vpmaxsd_avx2(auVar28,auVar54);
  auVar47 = vpminsd_avx2(auVar54,auVar27);
  auVar54 = vpmaxsd_avx2(auVar28,auVar17);
  auVar54 = vpminsd_avx2(auVar54,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar41);
  auVar43 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar9);
  auVar67 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar19);
  auVar61 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar42);
  auVar74 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpaddd_avx2(auVar60,auVar56);
  auVar9 = vpmulld_avx2(auVar61,auVar68);
  auVar9 = vpaddd_avx2(auVar9,auVar63);
  auVar42 = vpmulld_avx2(auVar54,auVar58);
  auVar9 = vpaddd_avx2(auVar42,auVar9);
  auVar42 = vpaddd_avx2(auVar61,auVar54);
  auVar54 = vpaddd_avx2(auVar72,auVar62);
  auVar62 = vpsubd_avx2(auVar62,auVar72);
  auVar69 = vpmaxsd_avx2(auVar28,auVar69);
  auVar56 = vpmaxsd_avx2(auVar28,auVar46);
  auVar59 = vpmaxsd_avx2(auVar28,auVar59);
  auVar60 = vpmaxsd_avx2(auVar13,auVar28);
  auVar53 = vpmaxsd_avx2(auVar53,auVar28);
  auVar61 = vpmaxsd_avx2(auVar28,auVar14);
  auVar45 = vpmaxsd_avx2(auVar28,auVar45);
  auVar46 = vpmaxsd_avx2(auVar15,auVar28);
  auVar54 = vpmaxsd_avx2(auVar54,auVar28);
  auVar62 = vpmaxsd_avx2(auVar62,auVar28);
  auVar69 = vpminsd_avx2(auVar69,auVar27);
  auVar56 = vpminsd_avx2(auVar56,auVar27);
  auVar59 = vpminsd_avx2(auVar59,auVar27);
  auVar60 = vpminsd_avx2(auVar60,auVar27);
  auVar53 = vpminsd_avx2(auVar53,auVar27);
  auVar61 = vpminsd_avx2(auVar61,auVar27);
  auVar45 = vpminsd_avx2(auVar45,auVar27);
  auVar46 = vpminsd_avx2(auVar46,auVar27);
  local_260 = vpminsd_avx2(auVar54,auVar27);
  auVar54 = vpminsd_avx2(auVar62,auVar27);
  auVar49 = vpsrad_avx2(auVar49,auVar64);
  auVar62 = vpsrad_avx2(auVar40,auVar64);
  auVar72 = vpsrad_avx2(auVar39,auVar64);
  auVar13 = vpsrad_avx2(auVar65,auVar64);
  auVar48 = vpsrad_avx2(auVar48,auVar64);
  auVar14 = vpsrad_avx2(auVar51,auVar64);
  auVar39 = vpsrad_avx2(auVar44,auVar64);
  auVar52 = vpsrad_avx2(auVar52,auVar64);
  auVar55 = vpsrad_avx2(auVar55,auVar64);
  auVar40 = vpmulld_avx2(auVar68,auVar41);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar15 = vpsrad_avx2(auVar40,auVar64);
  auVar16 = vpsrad_avx2(auVar9,auVar64);
  auVar40 = vpmulld_avx2(auVar68,auVar42);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar42 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpaddd_avx2(auVar11,auVar10);
  auVar65 = vpsubd_avx2(auVar10,auVar11);
  auVar11._4_4_ = local_480;
  auVar11._0_4_ = local_480;
  auVar11._8_4_ = local_480;
  auVar11._12_4_ = local_480;
  auVar11._16_4_ = local_480;
  auVar11._20_4_ = local_480;
  auVar11._24_4_ = local_480;
  auVar11._28_4_ = local_480;
  auVar40 = vpmaxsd_avx2(auVar40,auVar11);
  auVar10._4_4_ = local_4a0;
  auVar10._0_4_ = local_4a0;
  auVar10._8_4_ = local_4a0;
  auVar10._12_4_ = local_4a0;
  auVar10._16_4_ = local_4a0;
  auVar10._20_4_ = local_4a0;
  auVar10._24_4_ = local_4a0;
  auVar10._28_4_ = local_4a0;
  local_240 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpaddd_avx2(auVar39,auVar49);
  auVar51 = vpsubd_avx2(auVar49,auVar39);
  auVar39 = vpmaxsd_avx2(auVar65,auVar11);
  auVar65 = vpminsd_avx2(auVar39,auVar10);
  auVar40 = vpmaxsd_avx2(auVar40,auVar11);
  local_220 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpaddd_avx2(auVar48,auVar72);
  auVar44 = vpsubd_avx2(auVar72,auVar48);
  auVar39 = vpmaxsd_avx2(auVar51,auVar11);
  auVar48 = vpminsd_avx2(auVar39,auVar10);
  auVar40 = vpmaxsd_avx2(auVar40,auVar11);
  local_200 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpaddd_avx2(auVar57,auVar78);
  auVar41 = vpsubd_avx2(auVar78,auVar57);
  auVar39 = vpmaxsd_avx2(auVar44,auVar11);
  auVar51 = vpminsd_avx2(auVar39,auVar10);
  auVar40 = vpmaxsd_avx2(auVar40,auVar11);
  local_80 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpaddd_avx2(auVar73,auVar12);
  auVar9 = vpsubd_avx2(auVar12,auVar73);
  auVar39 = vpmaxsd_avx2(auVar41,auVar11);
  auVar44 = vpminsd_avx2(auVar39,auVar10);
  auVar40 = vpmaxsd_avx2(auVar40,auVar11);
  local_a0 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpaddd_avx2(auVar52,auVar62);
  auVar41 = vpsubd_avx2(auVar62,auVar52);
  auVar39 = vpmaxsd_avx2(auVar9,auVar11);
  auVar52 = vpminsd_avx2(auVar39,auVar10);
  auVar40 = vpmaxsd_avx2(auVar40,auVar11);
  local_c0 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpaddd_avx2(auVar14,auVar13);
  auVar9 = vpsubd_avx2(auVar13,auVar14);
  auVar39 = vpmaxsd_avx2(auVar41,auVar11);
  auVar41 = vpminsd_avx2(auVar39,auVar10);
  auVar40 = vpmaxsd_avx2(auVar40,auVar11);
  local_e0 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpaddd_avx2(auVar69,auVar67);
  auVar69 = vpsubd_avx2(auVar69,auVar67);
  auVar39 = vpmaxsd_avx2(auVar9,auVar11);
  auVar9 = vpminsd_avx2(auVar39,auVar10);
  auVar40 = vpmaxsd_avx2(auVar40,auVar11);
  local_460 = (__m256i)vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpmaxsd_avx2(auVar69,auVar11);
  local_280 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpaddd_avx2(auVar59,auVar74);
  auVar39 = vpsubd_avx2(auVar59,auVar74);
  auVar40 = vpmaxsd_avx2(auVar40,auVar11);
  local_440 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpmaxsd_avx2(auVar39,auVar11);
  local_2a0 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpaddd_avx2(auVar15,auVar53);
  auVar39 = vpsubd_avx2(auVar53,auVar15);
  auVar40 = vpmaxsd_avx2(auVar40,auVar11);
  local_420 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpmaxsd_avx2(auVar39,auVar11);
  local_2c0 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpaddd_avx2(auVar42,auVar45);
  auVar39 = vpsubd_avx2(auVar45,auVar42);
  auVar40 = vpmaxsd_avx2(auVar40,auVar11);
  local_400 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpmaxsd_avx2(auVar39,auVar11);
  local_2e0 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpaddd_avx2(auVar16,auVar46);
  auVar39 = vpsubd_avx2(auVar46,auVar16);
  auVar40 = vpmaxsd_avx2(auVar40,auVar11);
  local_3e0 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpmaxsd_avx2(auVar39,auVar11);
  local_300 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpaddd_avx2(auVar55,auVar61);
  auVar39 = vpsubd_avx2(auVar61,auVar55);
  auVar40 = vpmaxsd_avx2(auVar40,auVar11);
  local_3c0 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpmaxsd_avx2(auVar39,auVar11);
  local_320 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpaddd_avx2(auVar60,auVar43);
  auVar39 = vpsubd_avx2(auVar60,auVar43);
  auVar40 = vpmaxsd_avx2(auVar40,auVar11);
  local_3a0 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpmaxsd_avx2(auVar39,auVar11);
  local_340 = vpminsd_avx2(auVar40,auVar10);
  auVar40 = vpaddd_avx2(auVar56,auVar47);
  auVar39 = vpsubd_avx2(auVar56,auVar47);
  auVar40 = vpmaxsd_avx2(auVar40,auVar11);
  auVar39 = vpmaxsd_avx2(auVar39,auVar11);
  local_380 = vpminsd_avx2(auVar40,auVar10);
  local_360 = vpminsd_avx2(auVar39,auVar10);
  auVar40 = vpmulld_avx2(auVar51,auVar58);
  auVar39 = vpmulld_avx2(auVar9,auVar68);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar40 = vpaddd_avx2(auVar40,auVar39);
  auVar39 = vpaddd_avx2(auVar51,auVar9);
  local_1e0 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpmulld_avx2(auVar39,auVar68);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  local_100 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpmulld_avx2(auVar48,auVar58);
  auVar39 = vpmulld_avx2(auVar41,auVar68);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar40 = vpaddd_avx2(auVar40,auVar39);
  auVar39 = vpaddd_avx2(auVar48,auVar41);
  local_1c0 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpmulld_avx2(auVar39,auVar68);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  local_120 = vpsrad_avx2(auVar40,auVar64);
  auVar40 = vpmulld_avx2(auVar65,auVar58);
  auVar39 = vpmulld_avx2(auVar52,auVar68);
  auVar40 = vpaddd_avx2(auVar40,auVar63);
  auVar40 = vpaddd_avx2(auVar40,auVar39);
  auVar39 = vpaddd_avx2(auVar52,auVar65);
  auVar39 = vpmulld_avx2(auVar39,auVar68);
  auVar39 = vpaddd_avx2(auVar39,auVar63);
  local_140 = vpsrad_avx2(auVar39,auVar64);
  local_1a0 = vpsrad_avx2(auVar40,auVar64);
  auVar39 = vpmulld_avx2(auVar54,auVar58);
  auVar40 = vpmulld_avx2(auVar44,auVar68);
  auVar40 = vpaddd_avx2(auVar63,auVar40);
  auVar40 = vpaddd_avx2(auVar39,auVar40);
  auVar39 = vpaddd_avx2(auVar44,auVar54);
  auVar39 = vpmulld_avx2(auVar39,auVar68);
  auVar39 = vpaddd_avx2(auVar39,auVar63);
  local_180 = vpsrad_avx2(auVar40,auVar64);
  local_160 = vpsrad_avx2(auVar39,auVar64);
  iStack_49c = local_4a0;
  iStack_498 = local_4a0;
  iStack_494 = local_4a0;
  iStack_490 = local_4a0;
  iStack_48c = local_4a0;
  iStack_488 = local_4a0;
  iStack_484 = local_4a0;
  iStack_47c = local_480;
  iStack_478 = local_480;
  iStack_474 = local_480;
  iStack_470 = local_480;
  iStack_46c = local_480;
  iStack_468 = local_480;
  iStack_464 = local_480;
  idct32_stage9_avx2(&local_460,out,do_cols,bd,out_shift,(__m256i *)&local_480,(__m256i *)&local_4a0
                    );
  return;
}

Assistant:

static void idct32_low16_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospi30 = _mm256_set1_epi32(cospi[30]);
  const __m256i cospi46 = _mm256_set1_epi32(cospi[46]);
  const __m256i cospi14 = _mm256_set1_epi32(cospi[14]);
  const __m256i cospi54 = _mm256_set1_epi32(cospi[54]);
  const __m256i cospi22 = _mm256_set1_epi32(cospi[22]);
  const __m256i cospi38 = _mm256_set1_epi32(cospi[38]);
  const __m256i cospi6 = _mm256_set1_epi32(cospi[6]);
  const __m256i cospi26 = _mm256_set1_epi32(cospi[26]);
  const __m256i cospi10 = _mm256_set1_epi32(cospi[10]);
  const __m256i cospi18 = _mm256_set1_epi32(cospi[18]);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospim58 = _mm256_set1_epi32(-cospi[58]);
  const __m256i cospim42 = _mm256_set1_epi32(-cospi[42]);
  const __m256i cospim50 = _mm256_set1_epi32(-cospi[50]);
  const __m256i cospim34 = _mm256_set1_epi32(-cospi[34]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospim52 = _mm256_set1_epi32(-cospi[52]);
  const __m256i cospim36 = _mm256_set1_epi32(-cospi[36]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospim56 = _mm256_set1_epi32(-cospi[56]);
  const __m256i cospim24 = _mm256_set1_epi32(-cospi[24]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospim32 = _mm256_set1_epi32(-cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i rounding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i bf1[32];

  {
    // stage 0
    // stage 1
    bf1[0] = in[0];
    bf1[2] = in[8];
    bf1[4] = in[4];
    bf1[6] = in[12];
    bf1[8] = in[2];
    bf1[10] = in[10];
    bf1[12] = in[6];
    bf1[14] = in[14];
    bf1[16] = in[1];
    bf1[18] = in[9];
    bf1[20] = in[5];
    bf1[22] = in[13];
    bf1[24] = in[3];
    bf1[26] = in[11];
    bf1[28] = in[7];
    bf1[30] = in[15];

    // stage 2
    bf1[31] = half_btf_0_avx2(&cospi2, &bf1[16], &rounding, bit);
    bf1[16] = half_btf_0_avx2(&cospi62, &bf1[16], &rounding, bit);
    bf1[17] = half_btf_0_avx2(&cospim34, &bf1[30], &rounding, bit);
    bf1[30] = half_btf_0_avx2(&cospi30, &bf1[30], &rounding, bit);
    bf1[29] = half_btf_0_avx2(&cospi18, &bf1[18], &rounding, bit);
    bf1[18] = half_btf_0_avx2(&cospi46, &bf1[18], &rounding, bit);
    bf1[19] = half_btf_0_avx2(&cospim50, &bf1[28], &rounding, bit);
    bf1[28] = half_btf_0_avx2(&cospi14, &bf1[28], &rounding, bit);
    bf1[27] = half_btf_0_avx2(&cospi10, &bf1[20], &rounding, bit);
    bf1[20] = half_btf_0_avx2(&cospi54, &bf1[20], &rounding, bit);
    bf1[21] = half_btf_0_avx2(&cospim42, &bf1[26], &rounding, bit);
    bf1[26] = half_btf_0_avx2(&cospi22, &bf1[26], &rounding, bit);
    bf1[25] = half_btf_0_avx2(&cospi26, &bf1[22], &rounding, bit);
    bf1[22] = half_btf_0_avx2(&cospi38, &bf1[22], &rounding, bit);
    bf1[23] = half_btf_0_avx2(&cospim58, &bf1[24], &rounding, bit);
    bf1[24] = half_btf_0_avx2(&cospi6, &bf1[24], &rounding, bit);

    // stage 3
    bf1[15] = half_btf_0_avx2(&cospi4, &bf1[8], &rounding, bit);
    bf1[8] = half_btf_0_avx2(&cospi60, &bf1[8], &rounding, bit);
    bf1[9] = half_btf_0_avx2(&cospim36, &bf1[14], &rounding, bit);
    bf1[14] = half_btf_0_avx2(&cospi28, &bf1[14], &rounding, bit);
    bf1[13] = half_btf_0_avx2(&cospi20, &bf1[10], &rounding, bit);
    bf1[10] = half_btf_0_avx2(&cospi44, &bf1[10], &rounding, bit);
    bf1[11] = half_btf_0_avx2(&cospim52, &bf1[12], &rounding, bit);
    bf1[12] = half_btf_0_avx2(&cospi12, &bf1[12], &rounding, bit);

    addsub_avx2(bf1[16], bf1[17], bf1 + 16, bf1 + 17, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[19], bf1[18], bf1 + 19, bf1 + 18, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[20], bf1[21], bf1 + 20, bf1 + 21, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[23], bf1[22], bf1 + 23, bf1 + 22, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[24], bf1[25], bf1 + 24, bf1 + 25, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[27], bf1[26], bf1 + 27, bf1 + 26, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[28], bf1[29], bf1 + 28, bf1 + 29, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[31], bf1[30], bf1 + 31, bf1 + 30, &clamp_lo, &clamp_hi);

    // stage 4
    bf1[7] = half_btf_0_avx2(&cospi8, &bf1[4], &rounding, bit);
    bf1[4] = half_btf_0_avx2(&cospi56, &bf1[4], &rounding, bit);
    bf1[5] = half_btf_0_avx2(&cospim40, &bf1[6], &rounding, bit);
    bf1[6] = half_btf_0_avx2(&cospi24, &bf1[6], &rounding, bit);

    addsub_avx2(bf1[8], bf1[9], bf1 + 8, bf1 + 9, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[11], bf1[10], bf1 + 11, bf1 + 10, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[12], bf1[13], bf1 + 12, bf1 + 13, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[15], bf1[14], bf1 + 15, bf1 + 14, &clamp_lo, &clamp_hi);

    idct32_stage4_avx2(bf1, &cospim8, &cospi56, &cospi8, &cospim56, &cospim40,
                       &cospi24, &cospi40, &cospim24, &rounding, bit);

    // stage 5
    bf1[0] = half_btf_0_avx2(&cospi32, &bf1[0], &rounding, bit);
    bf1[1] = bf1[0];
    bf1[3] = half_btf_0_avx2(&cospi16, &bf1[2], &rounding, bit);
    bf1[2] = half_btf_0_avx2(&cospi48, &bf1[2], &rounding, bit);

    addsub_avx2(bf1[4], bf1[5], bf1 + 4, bf1 + 5, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[7], bf1[6], bf1 + 7, bf1 + 6, &clamp_lo, &clamp_hi);

    idct32_stage5_avx2(bf1, &cospim16, &cospi48, &cospi16, &cospim48, &clamp_lo,
                       &clamp_hi, &rounding, bit);

    // stage 6
    addsub_avx2(bf1[0], bf1[3], bf1 + 0, bf1 + 3, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[1], bf1[2], bf1 + 1, bf1 + 2, &clamp_lo, &clamp_hi);

    idct32_stage6_avx2(bf1, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rounding, bit);

    // stage 7
    idct32_stage7_avx2(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

    // stage 8
    idct32_stage8_avx2(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

    // stage 9
    idct32_stage9_avx2(bf1, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}